

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O1

void __thiscall
Key_NewLinesAreNotAllowed3_Test::~Key_NewLinesAreNotAllowed3_Test
          (Key_NewLinesAreNotAllowed3_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Key, NewLinesAreNotAllowed3) {
    std::istringstream input("key =\n 123");
    events_aggregator_t handler;

    try {
        loltoml::parse(input, handler);
        FAIL();
    } catch (const loltoml::parser_error_t &e) {
        EXPECT_EQ(5, e.offset());
    }
}